

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_file.c
# Opt level: O0

err_t cmdFileValExist(int count,char **names)

{
  int iVar1;
  bool_t bVar2;
  err_t eVar3;
  int in_EDI;
  file_t file;
  err_t code;
  char *in_stack_ffffffffffffffd8;
  file_t in_stack_ffffffffffffffe0;
  int local_8;
  
  local_8 = in_EDI;
  while( true ) {
    if (local_8 == 0) {
      return 0;
    }
    in_stack_ffffffffffffffe0 =
         fileOpen((char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    iVar1 = 0xcb;
    if (in_stack_ffffffffffffffe0 != (file_t)0x0) {
      iVar1 = 0;
    }
    if (iVar1 != 0) break;
    bVar2 = fileClose((file_t)0x105d3c);
    eVar3 = 0x67;
    if (bVar2 != 0) {
      eVar3 = 0;
    }
    local_8 = local_8 + -1;
    if (eVar3 != 0) {
      return eVar3;
    }
  }
  return 0xca;
}

Assistant:

err_t cmdFileValExist(int count, char* names[])
{
	err_t code;
	file_t file;
	for (; count--; names++)
	{
		ASSERT(strIsValid(*names));
		code = cmdFileOpen(file, *names, "rb");
		if (code != ERR_OK)
			return ERR_FILE_NOT_FOUND;
		code = cmdFileClose(file);
		ERR_CALL_CHECK(code);
	}
	return ERR_OK;
}